

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper-api.c
# Opt level: O3

int tlv_parse_data(uint8_t *buf,size_t buflen,int argc,...)

{
  undefined8 uVar1;
  char in_AL;
  int iVar2;
  uint uVar3;
  uint8_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint8_t *puVar7;
  uint64_t *puVar8;
  uint8_t *puVar9;
  uint8_t uVar10;
  undefined8 in_RCX;
  undefined4 *puVar11;
  uint64_t uVar12;
  long *plVar13;
  int *piVar14;
  undefined8 *puVar15;
  uint32_t block_size;
  undefined8 in_R8;
  long lVar16;
  undefined8 in_R9;
  int iVar17;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_148 [24];
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined4 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  int local_8c;
  uint64_t *local_88;
  ulong local_80;
  uint64_t *local_78;
  uint64_t *local_70;
  ndn_hmac_key_t *local_68;
  size_t local_60;
  uint8_t *local_58;
  uint32_t local_50;
  uint local_4c;
  uint32_t block_type;
  uint32_t block_len;
  va_list vl;
  
  if (in_AL != '\0') {
    local_118 = in_XMM0_Da;
    local_108 = in_XMM1_Qa;
    local_f8 = in_XMM2_Qa;
    local_e8 = in_XMM3_Qa;
    local_d8 = in_XMM4_Qa;
    local_c8 = in_XMM5_Qa;
    local_b8 = in_XMM6_Qa;
    local_a8 = in_XMM7_Qa;
  }
  local_130 = in_RCX;
  local_128 = in_R8;
  local_120 = in_R9;
  local_60 = buflen;
  puVar4 = tlv_get_type_length(buf,buflen,&local_50,&local_4c);
  if (puVar4 == (uint8_t *)0x0) {
    iVar2 = -0xe;
  }
  else {
    iVar2 = -0xc;
    if (local_50 == 6) {
      local_58 = buf + local_60;
      iVar2 = -0xd;
      if ((puVar4 + local_4c == local_58) &&
         (iVar2 = ndn_data_tlv_decode_no_verify
                            (&tlv_parse_data::data,buf,(uint32_t)local_60,(uint32_t *)0x0,
                             (uint32_t *)0x0), iVar2 == 0)) {
        vl[0].overflow_arg_area = local_148;
        vl[0]._0_8_ = &stack0x00000008;
        _block_type = 0x3000000018;
        iVar17 = 0;
        puVar9 = local_58;
        local_8c = argc;
        if (argc < 1) {
          local_88 = (uint64_t *)0x0;
          local_78 = (uint64_t *)0x0;
          local_70 = (uint64_t *)0x0;
          local_68 = (ndn_hmac_key_t *)0x0;
          local_80 = 0;
        }
        else {
          local_80 = 0;
          local_68 = (ndn_hmac_key_t *)0x0;
          local_70 = (uint64_t *)0x0;
          local_78 = (uint64_t *)0x0;
          local_88 = (uint64_t *)0x0;
          do {
            uVar5 = _block_type & 0xffffffff;
            if (uVar5 < 0x29) {
              puVar11 = (undefined4 *)(uVar5 + (long)vl[0].overflow_arg_area);
              uVar5 = (ulong)(block_type + 8);
              _block_type = CONCAT44(block_len,block_type + 8);
            }
            else {
              puVar11 = (undefined4 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            iVar2 = -0x12;
            uVar3 = (uint)uVar5;
            switch(*puVar11) {
            case 0:
              if (uVar3 < 0x29) {
                _block_type = CONCAT44(block_len,uVar3 + 8);
                puVar15 = (undefined8 *)(uVar5 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar15 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              if ((void *)*puVar15 == (void *)0x0) goto LAB_00111ebc;
              memcpy((void *)*puVar15,&tlv_parse_data::data,0x1bc);
              puVar9 = local_58;
              break;
            case 1:
              if (uVar3 < 0x29) {
                _block_type = CONCAT44(block_len,uVar3 + 8);
                puVar15 = (undefined8 *)(uVar5 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar15 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              local_88 = (uint64_t *)*puVar15;
              puVar8 = local_88;
              goto joined_r0x00111bfa;
            case 2:
              if (uVar3 < 0x29) {
                _block_type = CONCAT44(block_len,uVar3 + 8);
                puVar15 = (undefined8 *)(uVar5 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar15 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              puVar8 = (uint64_t *)*puVar15;
              if (puVar8 != (uint64_t *)0x0) {
                if (tlv_parse_data::data.name.components_size == 0) {
                  return -0x11;
                }
                uVar5 = (ulong)(tlv_parse_data::data.name.components_size - 1);
                uVar12 = 0xffffffffffffffff;
                if (((tlv_parse_data::data.name.components[uVar5].type == 8) &&
                    (uVar6 = (ulong)tlv_parse_data::data.name.components[uVar5].size, 1 < uVar6)) &&
                   (tlv_parse_data::data.name.components[uVar5].value[0] == '\0')) {
                  lVar16 = 0;
                  uVar12 = 0;
                  do {
                    uVar12 = uVar12 << 8 | (ulong)*(byte *)(uVar5 * 0x2c + 0x134b65 + lVar16);
                    lVar16 = lVar16 + 1;
                  } while (uVar6 - 1 != lVar16);
                }
                goto LAB_00111cd4;
              }
              goto LAB_00111ebc;
            case 3:
              if (uVar3 < 0x29) {
                _block_type = CONCAT44(block_len,uVar3 + 8);
                puVar15 = (undefined8 *)(uVar5 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar15 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              puVar7 = (uint8_t *)*puVar15;
              if (puVar7 == (uint8_t *)0x0) goto LAB_00111ebc;
              uVar10 = tlv_parse_data::data.metainfo.content_type;
              if (tlv_parse_data::data.metainfo.enable_ContentType != '\0') goto LAB_00111c34;
              *puVar7 = 0xff;
              break;
            case 4:
              if (uVar3 < 0x29) {
                _block_type = CONCAT44(block_len,uVar3 + 8);
                puVar15 = (undefined8 *)(uVar5 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar15 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              puVar8 = (uint64_t *)*puVar15;
              uVar10 = tlv_parse_data::data.metainfo.enable_FreshnessPeriod;
              uVar12 = tlv_parse_data::data.metainfo.freshness_period;
              goto joined_r0x00111c4d;
            case 5:
              if (uVar3 < 0x29) {
                _block_type = CONCAT44(block_len,uVar3 + 8);
                plVar13 = (long *)(uVar5 + (long)vl[0].overflow_arg_area);
              }
              else {
                plVar13 = (long *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              puVar15 = (undefined8 *)*plVar13;
              if (puVar15 == (undefined8 *)0x0) goto LAB_00111ebc;
              if (tlv_parse_data::data.metainfo.enable_FinalBlockId == '\0') {
                *(undefined1 *)(puVar15 + 5) = 0;
              }
              else {
                uVar1 = CONCAT44(tlv_parse_data::data.metainfo.final_block_id._40_4_,
                                 tlv_parse_data::data.metainfo.final_block_id.value._32_4_);
                *(ulong *)((long)puVar15 + 0x1c) =
                     CONCAT44(tlv_parse_data::data.metainfo.final_block_id.value._28_4_,
                              tlv_parse_data::data.metainfo.final_block_id.value._24_4_);
                *(undefined8 *)((long)puVar15 + 0x24) = uVar1;
                uVar1 = CONCAT44(tlv_parse_data::data.metainfo.final_block_id.value._24_4_,
                                 tlv_parse_data::data.metainfo.final_block_id.value._20_4_);
                puVar15[2] = tlv_parse_data::data.metainfo.final_block_id.value._12_8_;
                puVar15[3] = uVar1;
                uVar1 = tlv_parse_data::data.metainfo.final_block_id.value._4_8_;
                *puVar15 = CONCAT44(tlv_parse_data::data.metainfo.final_block_id.value._0_4_,
                                    tlv_parse_data::data.metainfo.final_block_id.type);
                puVar15[1] = uVar1;
              }
              break;
            case 6:
              if (uVar3 < 0x29) {
                _block_type = CONCAT44(block_len,uVar3 + 8);
                puVar15 = (undefined8 *)(uVar5 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar15 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              puVar8 = (uint64_t *)*puVar15;
              local_78 = puVar8;
              goto joined_r0x00111bfa;
            case 7:
              if (uVar3 < 0x29) {
                _block_type = CONCAT44(block_len,uVar3 + 8);
                puVar15 = (undefined8 *)(uVar5 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar15 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              puVar8 = (uint64_t *)*puVar15;
              if (puVar8 == (uint64_t *)0x0) goto LAB_00111ebc;
              if (tlv_parse_data::data.metainfo.enable_FinalBlockId != '\0') {
                uVar12 = 0xffffffffffffffff;
                if (((tlv_parse_data::data.metainfo.final_block_id.type == 8) &&
                    (1 < (ulong)(tlv_parse_data::data.metainfo.final_block_id._40_4_ & 0xff))) &&
                   (tlv_parse_data::data.metainfo.final_block_id.value[0] == '\0')) {
                  lVar16 = 0;
                  uVar12 = 0;
                  do {
                    uVar12 = uVar12 << 8 |
                             (ulong)tlv_parse_data::data.metainfo.final_block_id.value[lVar16 + 1];
                    lVar16 = lVar16 + 1;
                  } while ((ulong)(tlv_parse_data::data.metainfo.final_block_id._40_4_ & 0xff) - 1
                           != lVar16);
                }
                goto LAB_00111cd4;
              }
              *puVar8 = 0xffffffffffffffff;
              break;
            case 8:
              if (uVar3 < 0x29) {
                _block_type = CONCAT44(block_len,uVar3 + 8);
                puVar15 = (undefined8 *)(uVar5 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar15 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              puVar8 = (uint64_t *)*puVar15;
              local_70 = puVar8;
joined_r0x00111bfa:
              if (puVar8 == (uint64_t *)0x0) goto LAB_00111ebc;
LAB_00111cad:
              *puVar8 = 0;
              break;
            case 9:
              if (uVar3 < 0x29) {
                _block_type = CONCAT44(block_len,uVar3 + 8);
                puVar15 = (undefined8 *)(uVar5 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar15 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              puVar8 = (uint64_t *)*puVar15;
              if (puVar8 == (uint64_t *)0x0) goto LAB_00111ebc;
              uVar12 = (uint64_t)tlv_parse_data::data.content_size;
LAB_00111cd4:
              *puVar8 = uVar12;
              break;
            case 10:
              if (uVar3 < 0x29) {
                _block_type = CONCAT44(block_len,uVar3 + 8);
                puVar15 = (undefined8 *)(uVar5 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar15 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              puVar7 = (uint8_t *)*puVar15;
              uVar10 = tlv_parse_data::data.signature.sig_type;
              if (puVar7 == (uint8_t *)0x0) goto LAB_00111ebc;
LAB_00111c34:
              *puVar7 = uVar10;
              break;
            default:
              goto switchD_00111881_caseD_b;
            case 0xc:
              if (uVar3 < 0x29) {
                _block_type = CONCAT44(block_len,uVar3 + 8);
                puVar15 = (undefined8 *)(uVar5 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar15 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              local_68 = (ndn_hmac_key_t *)*puVar15;
              break;
            case 0xd:
              if (uVar3 < 0x29) {
                _block_type = CONCAT44(block_len,uVar3 + 8);
                puVar15 = (undefined8 *)(uVar5 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar15 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              puVar8 = (uint64_t *)*puVar15;
              uVar10 = tlv_parse_data::data.signature.enable_Timestamp;
              uVar12 = tlv_parse_data::data.signature.timestamp;
joined_r0x00111c4d:
              if (puVar8 != (uint64_t *)0x0) {
                if (uVar10 != '\0') goto LAB_00111cd4;
                goto LAB_00111cad;
              }
              goto LAB_00111ebc;
            case 0xe:
              if (uVar3 < 0x29) {
                uVar6 = (ulong)(uVar3 + 8);
                _block_type = CONCAT44(block_len,uVar3 + 8);
                piVar14 = (int *)(uVar5 + (long)vl[0].overflow_arg_area);
              }
              else {
                uVar6 = vl[0]._0_8_ + 8;
                piVar14 = (int *)vl[0]._0_8_;
                vl[0]._0_8_ = uVar6;
              }
              local_80 = CONCAT71((int7)(uVar6 >> 8),*piVar14 != 0);
            }
            iVar17 = iVar17 + 1;
          } while (iVar17 < local_8c);
        }
        puVar9 = tlv_get_type_length(puVar4,(long)puVar9 - (long)puVar4,&local_50,&local_4c);
        iVar2 = -0x11;
        if (local_50 == 7) {
          if (local_88 != (uint64_t *)0x0) {
            *local_88 = (uint64_t)puVar4;
          }
          puVar9 = puVar9 + local_4c;
          if ((tlv_parse_data::data.metainfo.enable_FinalBlockId != '\0') &&
             (local_78 != (uint64_t *)0x0)) {
            puVar4 = tlv_get_type_length(puVar9,(long)local_58 - (long)puVar9,&local_50,&local_4c);
            if (local_50 != 0x14) {
              return -0x11;
            }
            puVar9 = puVar4 + local_4c;
            if ((ulong)local_4c != 0) {
              do {
                puVar4 = tlv_get_type_length(puVar4,(long)local_58 - (long)puVar4,&local_50,
                                             &local_4c);
                if (local_50 == 0x1a) {
                  *local_78 = (uint64_t)puVar4;
                }
                puVar4 = puVar4 + local_4c;
              } while (puVar4 < puVar9);
            }
          }
          if ((local_70 != (uint64_t *)0x0) && (tlv_parse_data::data.content_size != 0)) {
            do {
              puVar4 = tlv_get_type_length(puVar9,(long)local_58 - (long)puVar9,&local_50,&local_4c)
              ;
              if (local_50 == 0x15) break;
              puVar9 = puVar4 + local_4c;
            } while (puVar9 < local_58);
            *local_70 = (uint64_t)puVar4;
          }
          iVar2 = 0;
          if ((local_80 & 1) != 0) {
            block_size = (uint32_t)local_60;
            if (tlv_parse_data::data.signature.sig_type == '\x04') {
              if (local_68 != (ndn_hmac_key_t *)0x0) {
                iVar2 = ndn_data_tlv_decode_hmac_verify
                                  (&tlv_parse_data::data,buf,block_size,local_68);
                return iVar2;
              }
            }
            else {
              if (tlv_parse_data::data.signature.sig_type != '\x03') {
                if (tlv_parse_data::data.signature.sig_type != '\0') {
                  return -0x1a;
                }
                iVar2 = ndn_data_tlv_decode_digest_verify(&tlv_parse_data::data,buf,block_size);
                return iVar2;
              }
              if (local_68 != (ndn_hmac_key_t *)0x0) {
                iVar2 = ndn_data_tlv_decode_ecdsa_verify
                                  (&tlv_parse_data::data,buf,block_size,(ndn_ecc_pub_t *)local_68);
                return iVar2;
              }
            }
LAB_00111ebc:
            iVar2 = -0x10;
          }
        }
      }
    }
  }
switchD_00111881_caseD_b:
  return iVar2;
}

Assistant:

int
tlv_parse_data(uint8_t* buf, size_t buflen, int argc, ...)
{
  static ndn_data_t data;
  va_list vl;
  int i, ret = NDN_SUCCESS;
  enum TLV_DATAARG_TYPE argtype;
  uint32_t block_type, block_len;
  uint8_t *ptr, *valptr, *end = buf + buflen;
  uint8_t **namebuf_ptr = NULL;
  uint8_t **finalblockid_ptr = NULL;
  uint8_t **content_ptr = NULL;
  void *arg_ptr = NULL;
  void *key_ptr = NULL;
  bool verify_sig = false;

  // Check type and length
  ptr = tlv_get_type_length(buf, buflen, &block_type, &block_len);
  if (ptr == NULL) {
    return NDN_OVERSIZE_VAR;
  }
  if (block_type != TLV_Data) {
    return NDN_WRONG_TLV_TYPE;
  }
  if (ptr + block_len != end) {
    return NDN_WRONG_TLV_LENGTH;
  }

  // Decode data
  ret = ndn_data_tlv_decode_no_verify(&data, buf, buflen, NULL, NULL);
  if (ret != NDN_SUCCESS) {
    return ret;
  }

  // Parse args
  va_start(vl, argc);
  for(i = 0; i < argc && ret == NDN_SUCCESS; i ++) {
    argtype = va_arg(vl, int);
    switch(argtype) {
      case TLV_DATAARG_NAME_PTR:
        arg_ptr = va_arg(vl, ndn_name_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *(ndn_name_t*)arg_ptr = data.name;
        break;

      case TLV_DATAARG_NAME_BUF:
        namebuf_ptr = va_arg(vl, uint8_t**);
        if (namebuf_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *namebuf_ptr = NULL;
        break;

      case TLV_DATAARG_NAME_SEGNO_U64:
        arg_ptr = va_arg(vl, uint64_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (data.name.components_size > 0) {
          *(uint64_t*)arg_ptr = tlv_decode_segno(&data.name.components[data.name.components_size - 1]);
        }
        else {
          ret = NDN_UNSUPPORTED_FORMAT;
        }
        break;

      case TLV_DATAARG_CONTENTTYPE_U8:
        arg_ptr = va_arg(vl, uint8_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (data.metainfo.enable_ContentType) {
          *(uint8_t*)arg_ptr = data.metainfo.content_type;
        }
        else {
          *(uint8_t*)arg_ptr = 0xFF;
        }
        break;

      case TLV_DATAARG_FRESHNESSPERIOD_U64:
        arg_ptr = va_arg(vl, uint64_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (data.metainfo.enable_FreshnessPeriod) {
          *(uint64_t*)arg_ptr = data.metainfo.freshness_period;
        }
        else {
          *(uint64_t*)arg_ptr = 0;
        }
        break;

      case TLV_DATAARG_FINALBLOCKID_PTR:
        arg_ptr = va_arg(vl, name_component_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (data.metainfo.enable_FinalBlockId) {
          *(name_component_t*)arg_ptr = data.metainfo.final_block_id;
        }
        else {
          ((name_component_t*)arg_ptr)->size = 0;
        }
        break;

      case TLV_DATAARG_FINALBLOCKID_BUF:
        finalblockid_ptr = va_arg(vl, uint8_t**);
        if (finalblockid_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *finalblockid_ptr = NULL;
        break;

      case TLV_DATAARG_FINALBLOCKID_U64:
        arg_ptr = va_arg(vl, uint64_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (data.metainfo.enable_FinalBlockId) {
          *(uint64_t*)arg_ptr = tlv_decode_segno(&data.metainfo.final_block_id);
        }
        else {
          *(uint64_t*)arg_ptr = (uint64_t)-1;
        }
        break;

      case TLV_DATAARG_CONTENT_BUF:
        content_ptr = va_arg(vl, uint8_t**);
        if (content_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *content_ptr = NULL;
        break;

      case TLV_DATAARG_CONTENT_SIZE:
        arg_ptr = va_arg(vl, size_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *(size_t*)arg_ptr = (size_t)data.content_size;
        break;

      case TLV_DATAARG_SIGTYPE_U8:
        arg_ptr = va_arg(vl, uint8_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *(uint8_t*)arg_ptr = data.signature.sig_type;
        break;

      case TLV_DATAARG_SIGKEY_PTR:
        key_ptr = va_arg(vl, void*);
        break;

      case TLV_DATAARG_SIGTIME_U64:
        arg_ptr = va_arg(vl, uint64_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
        }
        else if (data.signature.enable_Timestamp) {
          *(uint64_t*)arg_ptr = data.signature.timestamp;
        }
        else {
          *(uint64_t*)arg_ptr = 0;
        }
        break;

      case TLV_DATAARG_VERIFY:
        verify_sig = va_arg(vl, uint32_t);
        break;

      default:
        ret = NDN_INVALID_ARG;
        break;
    }
  }
  va_end(vl);
  if (ret != NDN_SUCCESS) {
    return ret;
  }

  // Decode Name (No need to check for NULL since decoding succeeded)
  valptr = tlv_get_type_length(ptr, end - ptr, &block_type, &block_len);
  if (block_type != TLV_Name) {
    return NDN_UNSUPPORTED_FORMAT;
  }
  if (namebuf_ptr != NULL) {
    *namebuf_ptr = ptr;
  }
  ptr = valptr + block_len;

  // Metainfo if applicable
  if (data.metainfo.enable_FinalBlockId && finalblockid_ptr != NULL) {
    valptr = tlv_get_type_length(ptr, end - ptr, &block_type, &block_len);
    if (block_type != TLV_MetaInfo) {
      return NDN_UNSUPPORTED_FORMAT;
    }
    ptr = valptr + block_len;

    while(valptr < ptr) {
      valptr = tlv_get_type_length(valptr, end - valptr, &block_type, &block_len);
      if (block_type == TLV_FinalBlockId) {
        *finalblockid_ptr = valptr;
      }
      valptr += block_len;
    }
  }

  // Content if applicable
  if (content_ptr && data.content_size > 0) {
    do{
      valptr = tlv_get_type_length(ptr, end - ptr, &block_type, &block_len);
      ptr = valptr + block_len;
    }while(block_type != TLV_Content && ptr < end);
    *content_ptr = valptr;
  }

  // Verify if required
  if (verify_sig) {
    switch(data.signature.sig_type) {
      case NDN_SIG_TYPE_DIGEST_SHA256:
        ret = ndn_data_tlv_decode_digest_verify(&data, buf, buflen);
        break;

      case NDN_SIG_TYPE_ECDSA_SHA256:
        if (key_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
        }
        else {
          ret = ndn_data_tlv_decode_ecdsa_verify(&data, buf, buflen, (ndn_ecc_pub_t*)key_ptr);
        }
        break;

      case NDN_SIG_TYPE_HMAC_SHA256:
        if (key_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
        }
        else {
          ret = ndn_data_tlv_decode_hmac_verify(&data, buf, buflen, (ndn_hmac_key_t*)key_ptr);
        }
        break;

      default:
        ret = NDN_SEC_UNSUPPORT_SIGN_TYPE;
        break;
    }
  }

  return ret;
}